

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O1

void __thiscall
antlr::TokenStreamRecognitionException::~TokenStreamRecognitionException
          (TokenStreamRecognitionException *this)

{
  ~TokenStreamRecognitionException(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual ~TokenStreamRecognitionException() throw()
	{
	}